

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdb.c
# Opt level: O2

void sysbvm_gdb_unregisterObjectFile(sysbvm_gdb_jit_code_entry_t *entry)

{
  sysbvm_gdb_jit_code_entry_t *psVar1;
  sysbvm_gdb_jit_code_entry_s *psVar2;
  sysbvm_gdb_jit_code_entry_s *psVar3;
  
  psVar1 = entry->next_entry;
  psVar2 = entry->prev_entry;
  psVar3 = (sysbvm_gdb_jit_code_entry_s *)&__jit_debug_descriptor.first_entry;
  if (psVar2 != (sysbvm_gdb_jit_code_entry_s *)0x0) {
    psVar3 = psVar2;
  }
  psVar3->next_entry = psVar1;
  if (psVar1 != (sysbvm_gdb_jit_code_entry_t *)0x0) {
    psVar1->prev_entry = psVar2;
  }
  entry->next_entry = (sysbvm_gdb_jit_code_entry_s *)0x0;
  entry->prev_entry = (sysbvm_gdb_jit_code_entry_s *)0x0;
  __jit_debug_descriptor.action_flag = 2;
  __jit_debug_descriptor.relevant_entry = entry;
  __jit_debug_register_code();
  return;
}

Assistant:

SYSBVM_API void sysbvm_gdb_unregisterObjectFile(sysbvm_gdb_jit_code_entry_t *entry)
{
    if(entry->prev_entry)
        entry->prev_entry->next_entry = entry->next_entry;
    else
        __jit_debug_descriptor.first_entry = entry->next_entry;

    if(entry->next_entry)
        entry->next_entry->prev_entry = entry->prev_entry;

    entry->prev_entry = entry->next_entry = NULL;
    
    __jit_debug_descriptor.relevant_entry = entry;
    __jit_debug_descriptor.action_flag = SYSBVM_GDB_JIT_UNREGISTER_FN;
    __jit_debug_register_code();
}